

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qplaintextedit.cpp
# Opt level: O3

void __thiscall QPlainTextEdit::mouseMoveEvent(QPlainTextEdit *this,QMouseEvent *e)

{
  QPlainTextEditPrivate *this_00;
  QPlainTextEditControl *this_01;
  QScrollBar *this_02;
  QWidgetData *pQVar1;
  bool bVar2;
  bool bVar3;
  qreal qVar4;
  char cVar5;
  LayoutDirection LVar6;
  int iVar7;
  int iVar8;
  long in_FS_OFFSET;
  double dVar9;
  double extraout_XMM1_Qa;
  double dVar10;
  undefined8 local_48;
  QPointF local_40;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QPlainTextEditPrivate **)
             &(this->super_QAbstractScrollArea).super_QFrame.super_QWidget.field_0x8;
  this_00->field_0x348 = this_00->field_0x348 & 0xef;
  dVar9 = (double)QEventPoint::position();
  dVar9 = (double)(((ulong)dVar9 >> 0x20 & 0x80000000) << 0x20 | 0x3fe0000000000000) + dVar9;
  bVar2 = 2147483647.0 < dVar9;
  if (dVar9 <= -2147483648.0) {
    dVar9 = -2147483648.0;
  }
  dVar10 = (double)((ulong)extraout_XMM1_Qa & 0x8000000000000000 | 0x3fe0000000000000) +
           extraout_XMM1_Qa;
  bVar3 = 2147483647.0 < dVar10;
  if (dVar10 <= -2147483648.0) {
    dVar10 = -2147483648.0;
  }
  local_48 = CONCAT44((int)(double)(-(ulong)bVar3 & 0x41dfffffffc00000 |
                                   ~-(ulong)bVar3 & (ulong)dVar10),
                      (int)(double)(-(ulong)bVar2 & 0x41dfffffffc00000 |
                                   ~-(ulong)bVar2 & (ulong)dVar9));
  this_01 = this_00->control;
  LVar6 = QWidget::layoutDirection
                    (*(QWidget **)
                      &(this_00->super_QAbstractScrollAreaPrivate).super_QFramePrivate.
                       super_QWidgetPrivate.field_0x8);
  this_02 = (this_00->super_QAbstractScrollAreaPrivate).hbar;
  if (LVar6 == RightToLeft) {
    iVar7 = QAbstractSlider::maximum(&this_02->super_QAbstractSlider);
    iVar8 = QAbstractSlider::value
                      (&((this_00->super_QAbstractScrollAreaPrivate).hbar)->super_QAbstractSlider);
    iVar7 = iVar7 - iVar8;
  }
  else {
    iVar7 = QAbstractSlider::value(&this_02->super_QAbstractSlider);
  }
  qVar4 = QPlainTextEditPrivate::verticalOffset(this_00,this_00->control->topBlock,this_00->topLine)
  ;
  local_40.yp = qVar4 + this_00->topLineFracture;
  local_40.xp = (double)iVar7;
  QWidgetTextControl::processEvent
            ((QWidgetTextControl *)this_01,(QEvent *)e,&local_40,
             (this_00->super_QAbstractScrollAreaPrivate).viewport);
  if (((byte)e[0x44] & 1) != 0) {
    iVar7 = QMouseEvent::source();
    if (iVar7 == 0) {
      pQVar1 = ((this_00->super_QAbstractScrollAreaPrivate).viewport)->data;
      local_40.yp = (qreal)CONCAT44((pQVar1->crect).y2.m_i - (pQVar1->crect).y1.m_i,
                                    (pQVar1->crect).x2.m_i - (pQVar1->crect).x1.m_i);
      local_40.xp = 0.0;
      cVar5 = QRect::contains((QPoint *)&local_40,SUB81(&local_48,0));
      if (cVar5 == '\0') {
        if ((this_00->autoScrollTimer).m_id == Invalid) {
          QBasicTimer::start(&this_00->autoScrollTimer,100000000,1,this);
        }
      }
      else {
        QBasicTimer::stop();
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QPlainTextEdit::mouseMoveEvent(QMouseEvent *e)
{
    Q_D(QPlainTextEdit);
    d->inDrag = false; // paranoia
    const QPoint pos = e->position().toPoint();
    d->sendControlEvent(e);
    if (!(e->buttons() & Qt::LeftButton))
        return;
    if (e->source() == Qt::MouseEventNotSynthesized) {
        const QRect visible = d->viewport->rect();
        if (visible.contains(pos))
            d->autoScrollTimer.stop();
        else if (!d->autoScrollTimer.isActive())
            d->autoScrollTimer.start(100, this);
    }
}